

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

undefined4 __thiscall
despot::RockSampleENTScenarioLowerBound::Value
          (RockSampleENTScenarioLowerBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  State *state;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_reference ppSVar5;
  reference pvVar6;
  const_reference pvVar7;
  double dVar8;
  int local_bc;
  int dist;
  int rock;
  Coord rock_pos;
  int local_ac;
  int id;
  int shortest;
  double discount;
  double value;
  ACT_TYPE action;
  int i_1;
  State *particle;
  double dStack_78;
  int i;
  double weight;
  int iStack_68;
  Coord rob_pos;
  allocator<double> local_51;
  undefined1 local_50 [8];
  vector<double,_std::allocator<double>_> expected_sampling_value;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  RockSampleENTScenarioLowerBound *this_local;
  
  iVar3 = this->rs_model_->num_rocks_;
  expected_sampling_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)history;
  std::allocator<double>::allocator(&local_51);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_50,(long)iVar3,&local_51);
  std::allocator<double>::~allocator(&local_51);
  despot::Coord::Coord((Coord *)((long)&weight + 4));
  dStack_78 = 0.0;
  for (particle._4_4_ = 0;
      sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles),
      (ulong)(long)particle._4_4_ < sVar4; particle._4_4_ = particle._4_4_ + 1) {
    ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (particles,(long)particle._4_4_);
    state = *ppSVar5;
    register0x00000000 = BaseRockSample::GetRobPos(this->rs_model_,state);
    dStack_78 = *(double *)(state + 0x18) + dStack_78;
    for (value._4_4_ = 0; value._4_4_ < this->rs_model_->num_rocks_; value._4_4_ = value._4_4_ + 1)
    {
      dVar8 = *(double *)(state + 0x18);
      bVar2 = BaseRockSample::GetRock(this->rs_model_,state,value._4_4_);
      iVar3 = -10;
      if (bVar2) {
        iVar3 = 10;
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_50,(long)value._4_4_);
      *pvVar6 = dVar8 * (double)iVar3 + *pvVar6;
    }
  }
  value._0_4_ = -1;
  discount = 0.0;
  _id = 1.0;
  while( true ) {
    local_ac = Grid<int>::xsize(this->grid_);
    iVar3 = Grid<int>::ysize(this->grid_);
    local_ac = local_ac + iVar3;
    _rock_pos = -1;
    despot::Coord::Coord((Coord *)&dist,-1,-1);
    for (local_bc = 0; uVar1 = stack0xffffffffffffff94, local_bc < this->rs_model_->num_rocks_;
        local_bc = local_bc + 1) {
      pvVar7 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                         (&this->rs_model_->rock_pos_,(long)local_bc);
      iVar3 = despot::Coord::ManhattanDistance(uVar1,*(undefined8 *)pvVar7);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_50,(long)local_bc);
      if ((0.1 < *pvVar6) && (iVar3 < local_ac)) {
        _rock_pos = local_bc;
        pvVar7 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                           (&this->rs_model_->rock_pos_,(long)local_bc);
        _dist = *(undefined8 *)pvVar7;
        local_ac = iVar3;
      }
    }
    if (_rock_pos == -1) break;
    if (value._0_4_ == -1) {
      if (dist < weight._4_4_) {
        value._0_4_ = 3;
      }
      else if (weight._4_4_ < dist) {
        value._0_4_ = 1;
      }
      else if (rock < iStack_68) {
        value._0_4_ = 2;
      }
      else if (iStack_68 < rock) {
        value._0_4_ = 0;
      }
      else {
        value._0_4_ = 4;
      }
    }
    iVar3 = despot::Coord::ManhattanDistance(_dist,stack0xffffffffffffff94);
    dVar8 = Globals::Discount(iVar3);
    _id = dVar8 * _id;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_50,(long)_rock_pos);
    discount = _id * *pvVar6 + discount;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_50,(long)_rock_pos);
    *pvVar6 = -1.0;
    unique0x00012000 = _dist;
  }
  if (value._0_4_ == -1) {
    value._0_4_ = 1;
  }
  iVar3 = Grid<int>::xsize(this->grid_);
  dVar8 = Globals::Discount(iVar3 - weight._4_4_);
  despot::ValuedAction::ValuedAction
            ((ValuedAction *)&this_local,value._0_4_,dStack_78 * 10.0 * _id * dVar8 + discount);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_50);
  return this_local._0_4_;
}

Assistant:

ValuedAction Value(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		vector<double> expected_sampling_value = vector<double>(
			rs_model_->num_rocks_);
		Coord rob_pos;
		double weight = 0;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			rob_pos = rs_model_->GetRobPos(particle);
			weight += particle->weight;
			for (int i = 0; i < rs_model_->num_rocks_; i++) {
				expected_sampling_value[i] += particle->weight
					* (rs_model_->GetRock(particle, i) ? 10 : -10);
			}
		}

		ACT_TYPE action = -1;
		double value = 0;
		double discount = 1.0;
		while (true) {
			// Move to the nearest valuable rock and sample
			int shortest = grid_.xsize() + grid_.ysize();
			int id = -1;
			Coord rock_pos(-1, -1);
			for (int rock = 0; rock < rs_model_->num_rocks_; rock++) {
				int dist = Coord::ManhattanDistance(rob_pos,
					rs_model_->rock_pos_[rock]);
				if (expected_sampling_value[rock] > 0.1 && dist < shortest) {
					shortest = dist;
					id = rock;
					rock_pos = rs_model_->rock_pos_[rock];
				}
			}
			/*
			 // Move to the most valuable rock and sample
			 int best = 0;
			 int id = -1;
			 Coord rock_pos(-1, -1);
			 for (int rock=0; rock<rs_model_->num_rocks_; rock++) {
			 double v = expected_sampling_value[rock] * Globals::Discount(Coord::ManhattanDistance(rob_pos, rs_model_->rock_pos_[rock]));
			 if (v > best) {
			 best = v;
			 id = rock;
			 rock_pos = rs_model_->rock_pos_[rock];
			 }
			 }
			 */

			if (id == -1)
				break;

			if (action == -1) {
				if (rock_pos.x < rob_pos.x)
					action = Compass::WEST;
				else if (rock_pos.x > rob_pos.x)
					action = Compass::EAST;
				else if (rock_pos.y < rob_pos.y)
					action = Compass::SOUTH;
				else if (rock_pos.y > rob_pos.y)
					action = Compass::NORTH;
				else
					action = rs_model_->E_SAMPLE;
			}

			discount *= Globals::Discount(Coord::ManhattanDistance(rock_pos, rob_pos));
			value += discount * expected_sampling_value[id];
			expected_sampling_value[id] = -1; // set to bad rock
			rob_pos = rock_pos;
		}

		if (action == -1)
			action = Compass::EAST;

		value += 10 * weight * discount * Globals::Discount(grid_.xsize() - rob_pos.x);

		return ValuedAction(action, value);
	}